

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O0

Clause * __thiscall CaDiCaL::Internal::new_driving_clause(Internal *this,int glue,int *jump)

{
  size_type sVar1;
  ulong uVar2;
  iterator iVar3;
  Var *pVVar4;
  int *in_RDX;
  int in_ESI;
  Internal *in_RDI;
  size_t N;
  Clause *res;
  size_t size;
  analyze_trail_negative_rank in_stack_000008d0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_000008d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_000008e0;
  analyze_trail_negative_rank in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  int glue_00;
  iterator in_stack_ffffffffffffffa0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffa8;
  Clause *local_28;
  
  glue_00 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->clause);
  if (sVar1 == 0) {
    *in_RDX = 0;
    local_28 = (Clause *)0x0;
  }
  else if (sVar1 == 1) {
    in_RDI->iterating = true;
    *in_RDX = 0;
    local_28 = (Clause *)0x0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)in_RDI);
    std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)in_RDI);
    uVar2 = __gnu_cxx::operator-
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff90.internal,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
    if ((ulong)(long)(in_RDI->opts).radixsortlim < uVar2) {
      in_stack_ffffffffffffffa0 =
           std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)in_RDI);
      iVar3 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)in_RDI);
      glue_00 = (int)((ulong)iVar3._M_current >> 0x20);
      analyze_trail_negative_rank::analyze_trail_negative_rank
                ((analyze_trail_negative_rank *)&stack0xffffffffffffff90,in_RDI);
      rsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,CaDiCaL::analyze_trail_negative_rank>
                (in_stack_000008e0,in_stack_000008d8,in_stack_000008d0);
    }
    else {
      std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)in_RDI);
      iVar3 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)in_RDI);
      analyze_trail_larger::analyze_trail_larger
                ((analyze_trail_larger *)&stack0xffffffffffffffa8,in_RDI);
      std::
      sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,CaDiCaL::analyze_trail_larger>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current
                 ,in_stack_ffffffffffffffa8,
                 (analyze_trail_larger)in_stack_ffffffffffffffa0._M_current);
    }
    std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->clause,1);
    pVVar4 = var(in_stack_ffffffffffffff90.internal,(int)((ulong)in_RDI >> 0x20));
    *in_RDX = pVVar4->level;
    local_28 = new_learned_redundant_clause
                         ((Internal *)in_stack_ffffffffffffffa0._M_current,glue_00);
    *(uint *)&local_28->field_0x8 =
         *(uint *)&local_28->field_0x8 & 0xffff3fff |
         ((in_ESI <= (in_RDI->opts).reducetier2glue) + 1) * 0x4000;
  }
  return local_28;
}

Assistant:

Clause *Internal::new_driving_clause (const int glue, int &jump) {

  const size_t size = clause.size ();
  Clause *res;

  if (!size) {

    jump = 0;
    res = 0;

  } else if (size == 1) {

    iterating = true;
    jump = 0;
    res = 0;

  } else {

    assert (clause.size () > 1);

    // We have to get the last assigned literals into the watch position.
    // Sorting all literals with respect to reverse assignment order is
    // overkill but seems to get slightly faster run-time.  For 'minimize'
    // we sort the literals too heuristically along the trail order (so in
    // the opposite order) with the hope to hit the recursion limit less
    // frequently.  Thus sorting effort is doubled here.
    //
    MSORT (opts.radixsortlim, clause.begin (), clause.end (),
           analyze_trail_negative_rank (this), analyze_trail_larger (this));

    jump = var (clause[1]).level;
    res = new_learned_redundant_clause (glue);
    res->used = 1 + (glue <= opts.reducetier2glue);
  }

  LOG ("jump level %d", jump);

  return res;
}